

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O3

int fffvcl(fitsfile *fptr,int *nvarcols,int *colnums,int *status)

{
  int iVar1;
  FITSfile *pFVar2;
  int iVar3;
  int *piVar4;
  int iVar5;
  bool bVar6;
  
  *nvarcols = 0;
  iVar3 = *status;
  if (0 < iVar3) {
    return iVar3;
  }
  pFVar2 = fptr->Fptr;
  if (pFVar2->hdutype == 2) {
    if ((pFVar2->tableptr != (tcolumn *)0x0) && (iVar1 = pFVar2->tfield, 0 < iVar1)) {
      piVar4 = &pFVar2->tableptr->tdatatype;
      iVar3 = 0;
      iVar5 = 1;
      do {
        if (*piVar4 < 0) {
          if (colnums != (int *)0x0) {
            colnums[iVar3] = iVar5;
            iVar3 = *nvarcols;
          }
          iVar3 = iVar3 + 1;
          *nvarcols = iVar3;
        }
        piVar4 = piVar4 + 0x28;
        bVar6 = iVar5 != iVar1;
        iVar5 = iVar5 + 1;
      } while (bVar6);
      iVar3 = *status;
    }
  }
  else {
    ffpmsg("Var-length column search can only be performed on Binary tables (fffvcl)");
    *status = 0xe3;
    iVar3 = 0xe3;
  }
  return iVar3;
}

Assistant:

int fffvcl(fitsfile *fptr,   /* I - FITS file pointer                       */
           int *nvarcols,    /* O - Number of variable length columns found */
           int *colnums,     /* O - 1-based variable column positions       */
           int *status)      /* IO - error status                           */
{
/*
   Internal function to identify which columns in a binary table are variable length.
   The colnums array will be filled with nvarcols elements - the 1-based numbers
   of all variable length columns in the table.  This ASSUMES calling function
   has passed in a colnums array large enough to hold these (colnums==NULL also 
   allowed).
*/
   int tfields=0,icol;
   tcolumn *colptr=0;
   
   *nvarcols = 0;
   if (*status > 0)
       return(*status);
       
   if ((fptr->Fptr)->hdutype != BINARY_TBL)
   {
      ffpmsg("Var-length column search can only be performed on Binary tables (fffvcl)");
      return(*status = NOT_BTABLE);
   }
   
   if ((fptr->Fptr)->tableptr)
   {
      colptr = (fptr->Fptr)->tableptr;
      tfields = (fptr->Fptr)->tfield;
      for (icol=0; icol<tfields; ++icol, ++colptr)
      {
         /* Condition for variable length column: negative tdatatype */
         if (colptr->tdatatype < 0)
         {
	    if (colnums) colnums[*nvarcols] = icol + 1;
	    *nvarcols += 1;            
         }
      }      
   }   
   return(*status);
}